

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall mjs::value::destroy(value *this)

{
  wostream *os;
  wstring_view local_198;
  wostringstream _woss;
  
  switch(this->type_) {
  case undefined:
  case null:
  case boolean:
  case number:
    break;
  case string:
  case object:
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&(this->field_1).s_);
    break;
  case reference:
    reference::~reference(&(this->field_1).r_);
    break;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
    os = std::operator<<((wostream *)&_woss,"Not implemented: ");
    mjs::operator<<(os,this->type_);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_198,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0x52);
  }
  this->type_ = undefined;
  return;
}

Assistant:

void value::destroy() {
    switch (type_) {
    case value_type::undefined: break;
    case value_type::null: break;
    case value_type::boolean: break;
    case value_type::number: break;
    case value_type::string: s_.~string(); break;
    case value_type::object: o_.~gc_heap_ptr(); break;
    case value_type::reference: r_.~reference(); break;
    default: NOT_IMPLEMENTED(type_);
    }
    type_ = value_type::undefined;
}